

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

string * __thiscall
toml::concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[21]>
          (string *__return_storage_ptr__,toml *this,char (*args) [38],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [21])

{
  void *this_00;
  char (*in_R9) [21];
  ostringstream local_1a0 [8];
  ostringstream oss;
  char (*args_local_2) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [38];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  this_00 = (void *)std::ostream::operator<<(local_1a0,std::boolalpha);
  std::ostream::operator<<(this_00,std::fixed);
  detail::concat_to_string_impl<char_const(&)[38],std::__cxx11::string,char_const(&)[21]>
            (__return_storage_ptr__,(detail *)local_1a0,(ostringstream *)this,args,args_1,in_R9);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string concat_to_string(Ts&& ... args)
{
    std::ostringstream oss;
    oss << std::boolalpha << std::fixed;
    return detail::concat_to_string_impl(oss, std::forward<Ts>(args) ...);
}